

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O1

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  sexp psVar2;
  int *piVar3;
  sexp_conflict psVar4;
  sexp_conflict op;
  sexp_conflict tmp;
  sexp_conflict name;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  
  name = (sexp_conflict)0x43e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  tmp = (sexp_conflict)0x43e;
  __sexp_gc_preserver2.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver2.next = (sexp_gc_var_t *)0x0;
  op = (sexp_conflict)0x43e;
  __sexp_gc_preserver3.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver3.next = (sexp_gc_var_t *)0x0;
  iVar1 = strcmp(version,"0.11.0");
  psVar4 = (sexp_conflict)0xb3e;
  if (iVar1 == 0) {
    iVar1 = strncmp(abi,"cv-gm*uh",8);
    if (iVar1 == 0) {
      __sexp_gc_preserver1.var = &name;
      __sexp_gc_preserver2.next = &__sexp_gc_preserver1;
      __sexp_gc_preserver1.next = (ctx->value).context.saves;
      (ctx->value).context.saves = __sexp_gc_preserver2.next;
      __sexp_gc_preserver2.var = &tmp;
      __sexp_gc_preserver3.next = &__sexp_gc_preserver2;
      (ctx->value).context.saves = __sexp_gc_preserver3.next;
      __sexp_gc_preserver3.var = &op;
      (ctx->value).context.saves = &__sexp_gc_preserver3;
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"%utf32->string",3,1,"sexp_25_utf32_3e_string_stub",
                      sexp_25_utf32_3e_string_stub,0x13e);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).uvector.length = 0xb;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"%utf16->string",3,1,"sexp_25_utf16_3e_string_stub",
                      sexp_25_utf16_3e_string_stub,0x13e);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).uvector.length = 0xb;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"%string->utf32",2,1,"sexp_25_string_3e_utf32_stub",
                      sexp_25_string_3e_utf32_stub,(((ctx->value).type.setters)->value).type.slots);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).port.offset = 0x13;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).string.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"%string->utf16",2,1,"sexp_25_string_3e_utf16_stub",
                      sexp_25_string_3e_utf16_stub,(((ctx->value).type.setters)->value).type.slots);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).port.offset = 0x13;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-ieee-double-set!",4,0,
                      "sexp_bytevector_ieee_double_set_x_stub",
                      sexp_bytevector_ieee_double_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).string.offset = 0x17;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-ieee-double-ref",3,0,
                      "sexp_bytevector_ieee_double_ref_stub",sexp_bytevector_ieee_double_ref_stub,0)
      ;
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x17;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-ieee-double-native-set!",3,0,
                      "sexp_bytevector_ieee_double_native_set_x_stub",
                      sexp_bytevector_ieee_double_native_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
        (op->value).port.line = 0x17;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-ieee-double-native-ref",2,0,
                      "sexp_bytevector_ieee_double_native_ref_stub",
                      sexp_bytevector_ieee_double_native_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x17;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-ieee-single-set!",4,0,
                      "sexp_bytevector_ieee_single_set_x_stub",
                      sexp_bytevector_ieee_single_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).string.offset = 0x17;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-ieee-single-ref",3,0,
                      "sexp_bytevector_ieee_single_ref_stub",sexp_bytevector_ieee_single_ref_stub,0)
      ;
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x17;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-ieee-single-native-set!",3,0,
                      "sexp_bytevector_ieee_single_native_set_x_stub",
                      sexp_bytevector_ieee_single_native_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
        (op->value).port.line = 0x17;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-ieee-single-native-ref",2,0,
                      "sexp_bytevector_ieee_single_native_ref_stub",
                      sexp_bytevector_ieee_single_native_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x17;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u64-set!",4,0,"sexp_bytevector_u64_set_x_stub",
                      sexp_bytevector_u64_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).string.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u64-ref",3,0,"sexp_bytevector_u64_ref_stub",
                      sexp_bytevector_u64_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u64-native-set!",3,0,
                      "sexp_bytevector_u64_native_set_x_stub",sexp_bytevector_u64_native_set_x_stub,
                      0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u64-native-ref",2,0,"sexp_bytevector_u64_native_ref_stub",
                      sexp_bytevector_u64_native_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u32-set!",4,0,"sexp_bytevector_u32_set_x_stub",
                      sexp_bytevector_u32_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).string.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u32-ref",3,0,"sexp_bytevector_u32_ref_stub",
                      sexp_bytevector_u32_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u32-native-set!",3,0,
                      "sexp_bytevector_u32_native_set_x_stub",sexp_bytevector_u32_native_set_x_stub,
                      0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u32-native-ref",2,0,"sexp_bytevector_u32_native_ref_stub",
                      sexp_bytevector_u32_native_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u16-set!",4,0,"sexp_bytevector_u16_set_x_stub",
                      sexp_bytevector_u16_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).string.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u16-ref",3,0,"sexp_bytevector_u16_ref_stub",
                      sexp_bytevector_u16_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u16-native-set!",3,0,
                      "sexp_bytevector_u16_native_set_x_stub",sexp_bytevector_u16_native_set_x_stub,
                      0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-u16-native-ref",2,0,"sexp_bytevector_u16_native_ref_stub",
                      sexp_bytevector_u16_native_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s64-set!",4,0,"sexp_bytevector_s64_set_x_stub",
                      sexp_bytevector_s64_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).string.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s64-ref",3,0,"sexp_bytevector_s64_ref_stub",
                      sexp_bytevector_s64_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s64-native-set!",3,0,
                      "sexp_bytevector_s64_native_set_x_stub",sexp_bytevector_s64_native_set_x_stub,
                      0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s64-native-ref",2,0,"sexp_bytevector_s64_native_ref_stub",
                      sexp_bytevector_s64_native_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s32-set!",4,0,"sexp_bytevector_s32_set_x_stub",
                      sexp_bytevector_s32_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).string.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s32-ref",3,0,"sexp_bytevector_s32_ref_stub",
                      sexp_bytevector_s32_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s32-native-set!",3,0,
                      "sexp_bytevector_s32_native_set_x_stub",sexp_bytevector_s32_native_set_x_stub,
                      0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s32-native-ref",2,0,"sexp_bytevector_s32_native_ref_stub",
                      sexp_bytevector_s32_native_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s16-set!",4,0,"sexp_bytevector_s16_set_x_stub",
                      sexp_bytevector_s16_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
        psVar2 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (op->value).type.finalize_name = psVar2;
        (psVar2->value).string.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s16-ref",3,0,"sexp_bytevector_s16_ref_stub",
                      sexp_bytevector_s16_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).port.offset = 0x11;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s16-native-set!",3,0,
                      "sexp_bytevector_s16_native_set_x_stub",sexp_bytevector_s16_native_set_x_stub,
                      0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s16-native-ref",2,0,"sexp_bytevector_s16_native_ref_stub",
                      sexp_bytevector_s16_native_ref_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"bytevector-s8-set!",3,0,"sexp_bytevector_s8_set_x_stub",
                      sexp_bytevector_s8_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 0x43e;
        (op->value).type.id = (sexp)0x11;
        (op->value).port.offset = 5;
        (op->value).port.line = 5;
      }
      piVar3 = (int *)sexp_define_foreign_aux
                                (ctx,env,"bytevector-s8-ref",2,0,"sexp_bytevector_s8_ref_stub",
                                 sexp_bytevector_s8_ref_stub,0);
      if ((((ulong)piVar3 & 3) == 0) && (*piVar3 == 0x1b)) {
        piVar3[10] = 5;
        piVar3[0xb] = 0;
        piVar3[0xc] = 0x11;
        piVar3[0xd] = 0;
        piVar3[0xe] = 5;
        piVar3[0xf] = 0;
      }
      (ctx->value).context.saves = __sexp_gc_preserver1.next;
      psVar4 = (sexp_conflict)0x43e;
    }
  }
  return psVar4;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  op = sexp_define_foreign_opt(ctx, env, "%utf32->string", 3, sexp_25_utf32_3e_string_stub, sexp_make_boolean(SEXP_FALSE));
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_BOOLEAN));
  }
  op = sexp_define_foreign_opt(ctx, env, "%utf16->string", 3, sexp_25_utf16_3e_string_stub, sexp_make_boolean(SEXP_FALSE));
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_BOOLEAN));
  }
  op = sexp_define_foreign_opt(ctx, env, "%string->utf32", 2, sexp_25_string_3e_utf32_stub, sexp_global(ctx, SEXP_G_ENDIANNESS));
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign_opt(ctx, env, "%string->utf16", 2, sexp_25_string_3e_utf16_stub, sexp_global(ctx, SEXP_G_ENDIANNESS));
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-double-set!", 4, sexp_bytevector_ieee_double_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FLONUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-double-ref", 3, sexp_bytevector_ieee_double_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-double-native-set!", 3, sexp_bytevector_ieee_double_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-double-native-ref", 2, sexp_bytevector_ieee_double_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-single-set!", 4, sexp_bytevector_ieee_single_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FLONUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-single-ref", 3, sexp_bytevector_ieee_single_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-single-native-set!", 3, sexp_bytevector_ieee_single_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-single-native-ref", 2, sexp_bytevector_ieee_single_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u64-set!", 4, sexp_bytevector_u64_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u64-ref", 3, sexp_bytevector_u64_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u64-native-set!", 3, sexp_bytevector_u64_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u64-native-ref", 2, sexp_bytevector_u64_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u32-set!", 4, sexp_bytevector_u32_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u32-ref", 3, sexp_bytevector_u32_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u32-native-set!", 3, sexp_bytevector_u32_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u32-native-ref", 2, sexp_bytevector_u32_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u16-set!", 4, sexp_bytevector_u16_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u16-ref", 3, sexp_bytevector_u16_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u16-native-set!", 3, sexp_bytevector_u16_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u16-native-ref", 2, sexp_bytevector_u16_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s64-set!", 4, sexp_bytevector_s64_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s64-ref", 3, sexp_bytevector_s64_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s64-native-set!", 3, sexp_bytevector_s64_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s64-native-ref", 2, sexp_bytevector_s64_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s32-set!", 4, sexp_bytevector_s32_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s32-ref", 3, sexp_bytevector_s32_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s32-native-set!", 3, sexp_bytevector_s32_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s32-native-ref", 2, sexp_bytevector_s32_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s16-set!", 4, sexp_bytevector_s16_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s16-ref", 3, sexp_bytevector_s16_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s16-native-set!", 3, sexp_bytevector_s16_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s16-native-ref", 2, sexp_bytevector_s16_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s8-set!", 3, sexp_bytevector_s8_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s8-ref", 2, sexp_bytevector_s8_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}